

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

size_t __thiscall
brotli::HashToBinaryTree::FindAllMatches
          (HashToBinaryTree *this,uint8_t *data,size_t ring_buffer_mask,size_t cur_ix,
          size_t max_length,size_t max_backward,BackwardMatch *matches)

{
  bool bVar1;
  size_t sVar2;
  BackwardMatch *pBVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  BackwardMatch BVar8;
  ulong uVar9;
  size_t l;
  ulong uVar10;
  size_t min_length;
  uint8_t *data_00;
  allocator_type local_89;
  BackwardMatch *local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  long local_68;
  HashToBinaryTree *local_60;
  size_t local_58;
  size_t local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dict_matches;
  
  local_80 = 1;
  uVar4 = 0;
  if (0x3f < cur_ix) {
    uVar4 = cur_ix - 0x40;
  }
  data_00 = data + (cur_ix & ring_buffer_mask);
  sVar2 = 1;
  local_68 = cur_ix + 1;
  local_88 = matches;
  local_78 = max_backward;
  local_70 = max_length;
  local_60 = this;
  local_58 = cur_ix;
  do {
    uVar10 = local_68 - cur_ix;
    uVar6 = sVar2;
    uVar9 = local_78;
    local_50 = sVar2;
    while( true ) {
      sVar2 = local_70;
      cur_ix = cur_ix - 1;
      if (((cur_ix <= uVar4) || (2 < uVar6)) || (uVar9 < uVar10)) {
        pBVar3 = local_88;
        local_80 = uVar6;
        if (uVar6 < local_70) {
          pBVar3 = StoreAndFindMatches(local_60,data,local_58,ring_buffer_mask,local_70,&local_80,
                                       local_88);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&dict_matches,0x26,&kInvalidMatch,&local_89);
        min_length = 4;
        if (4 < local_80 + 1) {
          min_length = local_80 + 1;
        }
        bVar1 = FindAllStaticDictionaryMatches
                          (data_00,min_length,sVar2,
                           dict_matches.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start);
        if (bVar1) {
          uVar4 = 0x25;
          if (sVar2 < 0x25) {
            uVar4 = sVar2;
          }
          lVar5 = min_length << 5;
          for (; min_length <= uVar4; min_length = min_length + 1) {
            uVar7 = dict_matches.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[min_length];
            if (uVar7 < 0xfffffff) {
              BVar8.distance = (uVar7 >> 5) + (int)local_78 + 1;
              uVar7 = uVar7 & 0x1f;
              if (min_length == uVar7) {
                uVar7 = 0;
              }
              BVar8.length_and_code = uVar7 | (uint)lVar5;
              *pBVar3 = BVar8;
              pBVar3 = pBVar3 + 1;
            }
            lVar5 = lVar5 + 0x20;
          }
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&dict_matches.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        return (long)pBVar3 - (long)matches >> 3;
      }
      if (((*data_00 == data[cur_ix & ring_buffer_mask]) &&
          (data_00[1] == (data + (cur_ix & ring_buffer_mask))[1])) &&
         (sVar2 = FindMatchLengthWithLimit(data + (cur_ix & ring_buffer_mask),data_00,local_70),
         uVar6 = local_50, uVar9 = local_78, local_50 < sVar2)) break;
      uVar10 = uVar10 + 1;
    }
    *local_88 = (BackwardMatch)(uVar10 & 0xffffffff | sVar2 << 0x25);
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

size_t FindAllMatches(const uint8_t* data,
                        const size_t ring_buffer_mask,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        BackwardMatch* matches) {
    BackwardMatch* const orig_matches = matches;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    size_t best_len = 1;
    size_t stop = cur_ix - 64;
    if (cur_ix < 64) { stop = 0; }
    for (size_t i = cur_ix - 1; i > stop && best_len <= 2; --i) {
      size_t prev_ix = i;
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (data[cur_ix_masked] != data[prev_ix] ||
          data[cur_ix_masked + 1] != data[prev_ix + 1]) {
        continue;
      }
      const size_t len =
          FindMatchLengthWithLimit(&data[prev_ix], &data[cur_ix_masked],
                                   max_length);
      if (len > best_len) {
        best_len = len;
        *matches++ = BackwardMatch(backward, len);
      }
    }
    if (best_len < max_length) {
      matches = StoreAndFindMatches(data, cur_ix, ring_buffer_mask,
                                    max_length, &best_len, matches);
    }
    std::vector<uint32_t> dict_matches(kMaxDictionaryMatchLen + 1,
                                       kInvalidMatch);
    size_t minlen = std::max<size_t>(4, best_len + 1);
    if (FindAllStaticDictionaryMatches(&data[cur_ix_masked], minlen, max_length,
                                       &dict_matches[0])) {
      size_t maxlen = std::min<size_t>(kMaxDictionaryMatchLen, max_length);
      for (size_t l = minlen; l <= maxlen; ++l) {
        uint32_t dict_id = dict_matches[l];
        if (dict_id < kInvalidMatch) {
          *matches++ = BackwardMatch(max_backward + (dict_id >> 5) + 1, l,
                                     dict_id & 31);
        }
      }
    }
    return static_cast<size_t>(matches - orig_matches);
  }